

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileSystemListView.cpp
# Opt level: O2

void QFileSystemListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *nameFilters;
  QArrayDataPointer<QString> *this;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QString *pQVar6;
  bool bVar7;
  Filters FVar8;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      rootPathChanged((QFileSystemListView *)_o,(QString *)_a[1]);
      return;
    }
    if (_id == 1) {
      fileRenamed((QFileSystemListView *)_o,(QString *)_a[1],(QString *)_a[2],(QString *)_a[3]);
      return;
    }
    if (_id == 0) {
      directoryLoaded((QFileSystemListView *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (7 < (uint)_id) {
      return;
    }
    this = (QArrayDataPointer<QString> *)*_a;
    switch(_id) {
    case 0:
      bVar7 = nameFilterDisables((QFileSystemListView *)_o);
      break;
    case 1:
      bVar7 = readOnly((QFileSystemListView *)_o);
      break;
    case 2:
      bVar7 = resolveSymlinks((QFileSystemListView *)_o);
      break;
    case 3:
      bVar7 = browsable((QFileSystemListView *)_o);
      break;
    case 4:
      FVar8 = filters((QFileSystemListView *)_o);
      goto LAB_001831d8;
    case 5:
      QFileSystemListView::nameFilters((QStringList *)&local_28,(QFileSystemListView *)_o);
      QArrayDataPointer<QString>::operator=(this,&local_28);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 6:
      FVar8.i = visibleSection((QFileSystemListView *)_o);
LAB_001831d8:
      *(Int *)&this->d = FVar8.i;
      return;
    case 7:
      rootPath((QString *)&local_28,(QFileSystemListView *)_o);
      pDVar5 = this->d;
      pQVar6 = this->ptr;
      this->d = local_28.d;
      this->ptr = local_28.ptr;
      qVar4 = this->size;
      this->size = local_28.size;
      local_28.d = pDVar5;
      local_28.ptr = pQVar6;
      local_28.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_28);
      return;
    }
    *(bool *)&this->d = bVar7;
    break;
  case WriteProperty:
    if ((uint)_id < 8) {
      nameFilters = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setNameFilterDisables((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 1:
        setReadOnly((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 2:
        setResolveSymlinks((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 3:
        setBrowsable((QFileSystemListView *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 4:
        setFilters((QFileSystemListView *)_o,(Filters)*(Int *)&(nameFilters->d).d);
        return;
      case 5:
        setNameFilters((QFileSystemListView *)_o,nameFilters);
        return;
      case 6:
        setVisibleSection((QFileSystemListView *)_o,*(Section *)&(nameFilters->d).d);
        return;
      case 7:
        setRootPath((QFileSystemListView *)_o,(QString *)nameFilters);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == directoryLoaded && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == fileRenamed && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == rootPathChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
  }
  return;
}

Assistant:

void QFileSystemListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileSystemListView::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::directoryLoaded)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QFileSystemListView::*)(const QString & , const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::fileRenamed)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QFileSystemListView::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemListView::rootPathChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->nameFilterDisables(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->readOnly(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->resolveSymlinks(); break;
        case 3: *reinterpret_cast< bool*>(_v) = _t->browsable(); break;
        case 4: *reinterpret_cast< QDir::Filters*>(_v) = _t->filters(); break;
        case 5: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 6: *reinterpret_cast< QFileSystemListView::Section*>(_v) = _t->visibleSection(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->rootPath(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QFileSystemListView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFilterDisables(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setResolveSymlinks(*reinterpret_cast< bool*>(_v)); break;
        case 3: _t->setBrowsable(*reinterpret_cast< bool*>(_v)); break;
        case 4: _t->setFilters(*reinterpret_cast< QDir::Filters*>(_v)); break;
        case 5: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 6: _t->setVisibleSection(*reinterpret_cast< QFileSystemListView::Section*>(_v)); break;
        case 7: _t->setRootPath(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}